

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O1

int hash_block(gost_hash_ctx *ctx,byte *block,size_t length)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  size_t __n;
  
  iVar3 = ctx->left;
  if ((long)iVar3 != 0) {
    __n = length & 0xffffffff;
    if (0x20U - iVar3 <= length) {
      __n = (size_t)(0x20U - iVar3);
    }
    memcpy(ctx->remainder + iVar3,block,__n);
    iVar3 = (int)__n + ctx->left;
    ctx->left = iVar3;
    if (0x1f < iVar3) {
      block = block + __n;
      hash_step(ctx->cipher_ctx,ctx->H,ctx->remainder);
      uVar2 = 0;
      lVar1 = 0x34;
      do {
        uVar2 = (uint)ctx->H[lVar1 + 0xc] + ctx->H[lVar1 + -0x14] + uVar2;
        ctx->H[lVar1 + -0x14] = (byte)uVar2;
        uVar2 = uVar2 >> 8;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x54);
      length = length - __n;
      ctx->len = ctx->len + 0x20;
      ctx->left = 0;
    }
    if (iVar3 < 0x20) {
      return 1;
    }
  }
  if (0x1f < length) {
    do {
      hash_step(ctx->cipher_ctx,ctx->H,block);
      uVar2 = 0;
      lVar1 = 0x34;
      do {
        uVar2 = (uint)block[lVar1 + -0x34] + ctx->H[lVar1 + -0x14] + uVar2;
        ctx->H[lVar1 + -0x14] = (byte)uVar2;
        uVar2 = uVar2 >> 8;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x54);
      ctx->len = ctx->len + 0x20;
      block = block + 0x20;
      length = length - 0x20;
    } while (0x1f < length);
  }
  if (length != 0) {
    ctx->left = (int)length;
    memcpy(ctx->remainder,block,length);
  }
  return 1;
}

Assistant:

int hash_block(gost_hash_ctx * ctx, const byte * block, size_t length)
{
    if (ctx->left) {
        /*
         * There are some bytes from previous step
         */
        unsigned int add_bytes = 32 - ctx->left;
        if (add_bytes > length) {
            add_bytes = length;
        }
        memcpy(&(ctx->remainder[ctx->left]), block, add_bytes);
        ctx->left += add_bytes;
        if (ctx->left < 32) {
            return 1;
        }
        block += add_bytes;
        length -= add_bytes;
        hash_step(ctx->cipher_ctx, ctx->H, ctx->remainder);
        add_blocks(32, ctx->S, ctx->remainder);
        ctx->len += 32;
        ctx->left = 0;
    }
    while (length >= 32) {
        hash_step(ctx->cipher_ctx, ctx->H, block);

        add_blocks(32, ctx->S, block);
        ctx->len += 32;
        block += 32;
        length -= 32;
    }
    if (length) {
        memcpy(ctx->remainder, block, ctx->left = length);
    }
    return 1;
}